

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_BothSet_Test::TestBody
          (GeneratedMessageReflectionSwapTest_BothSet_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_6d0;
  Message local_6c8;
  int32_t local_6c0;
  int local_6bc;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar;
  Reflection *reflection;
  undefined1 local_690 [8];
  TestAllTypes rhs;
  TestAllTypes lhs;
  GeneratedMessageReflectionSwapTest_BothSet_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&rhs.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_690);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)((long)&rhs.field_0 + 0x328));
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>((TestAllTypes *)local_690);
  TestUtil::ModifyRepeatedFields<proto2_unittest::TestAllTypes>((TestAllTypes *)local_690);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )proto2_unittest::TestAllTypes::GetReflection();
  GeneratedMessageReflectionSwapTest::Swap
            (&this->super_GeneratedMessageReflectionSwapTest,
             (Reflection *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(Message *)((long)&rhs.field_0 + 0x328),(Message *)local_690);
  TestUtil::ExpectRepeatedFieldsModified<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)((long)&rhs.field_0 + 0x328));
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::set_optional_int32
            ((TestAllTypes *)((long)&rhs.field_0 + 0x328),0x82153);
  GeneratedMessageReflectionSwapTest::Swap
            (&this->super_GeneratedMessageReflectionSwapTest,
             (Reflection *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(Message *)((long)&rhs.field_0 + 0x328),(Message *)local_690);
  local_6bc = 0x82153;
  local_6c0 = proto2_unittest::TestAllTypes::optional_int32((TestAllTypes *)local_690);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_6b8,"532819","rhs.optional_int32()",&local_6bc,&local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(&local_6c8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x140,message);
    testing::internal::AssertHelper::operator=(&local_6d0,&local_6c8);
    testing::internal::AssertHelper::~AssertHelper(&local_6d0);
    testing::Message::~Message(&local_6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&rhs.field_0 + 0x328));
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, BothSet) {
  unittest::TestAllTypes lhs;
  unittest::TestAllTypes rhs;

  TestUtil::SetAllFields(&lhs);
  TestUtil::SetAllFields(&rhs);
  TestUtil::ModifyRepeatedFields(&rhs);

  const Reflection* reflection = lhs.GetReflection();
  Swap(reflection, &lhs, &rhs);

  TestUtil::ExpectRepeatedFieldsModified(lhs);
  TestUtil::ExpectAllFieldsSet(rhs);

  lhs.set_optional_int32(532819);

  Swap(reflection, &lhs, &rhs);

  EXPECT_EQ(532819, rhs.optional_int32());
}